

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_utils.cpp
# Opt level: O2

bool SignSignature(SigningProvider *provider,CScript *fromPubKey,CMutableTransaction *txTo,uint nIn,
                  CAmount *amount,int nHashType,SignatureData *sig_data)

{
  long lVar1;
  bool bVar2;
  reference input;
  long in_FS_OFFSET;
  MutableTransactionSignatureCreator creator;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((ulong)(((long)(txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(txTo->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x68) <= (ulong)nIn) {
    __assert_fail("nIn < txTo.vin.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/transaction_utils.cpp"
                  ,0x60,
                  "bool SignSignature(const SigningProvider &, const CScript &, CMutableTransaction &, unsigned int, const CAmount &, int, SignatureData &)"
                 );
  }
  MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
            (&creator,txTo,nIn,amount,nHashType);
  bVar2 = ProduceSignature(provider,&creator.super_BaseSignatureCreator,fromPubKey,sig_data);
  input = std::vector<CTxIn,_std::allocator<CTxIn>_>::at(&txTo->vin,(ulong)nIn);
  UpdateInput(input,sig_data);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool SignSignature(const SigningProvider &provider, const CScript& fromPubKey, CMutableTransaction& txTo, unsigned int nIn, const CAmount& amount, int nHashType, SignatureData& sig_data)
{
    assert(nIn < txTo.vin.size());

    MutableTransactionSignatureCreator creator(txTo, nIn, amount, nHashType);

    bool ret = ProduceSignature(provider, creator, fromPubKey, sig_data);
    UpdateInput(txTo.vin.at(nIn), sig_data);
    return ret;
}